

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkDupOneBuffer(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFanin,Vec_Int_t *vFanins,
                        int fIsFi)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  int *piVar3;
  
  uVar2 = Wlc_ObjAlloc(pNew,7,*(uint *)pObj >> 6 & 1,pObj->End,pObj->Beg);
  if (((int)uVar2 < 1) || (pNew->nObjsAlloc <= (int)uVar2)) {
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                  ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  pWVar1 = pNew->pObjs;
  if (vFanins->nCap < 1) {
    if (vFanins->pArray == (int *)0x0) {
      piVar3 = (int *)malloc(4);
    }
    else {
      piVar3 = (int *)realloc(vFanins->pArray,4);
    }
    vFanins->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = 1;
  }
  *vFanins->pArray = iFanin;
  vFanins->nSize = 1;
  Wlc_ObjAddFanins(pNew,pWVar1 + uVar2,vFanins);
  Wlc_ObjSetCo(pNew,pWVar1 + uVar2,fIsFi);
  return;
}

Assistant:

void Wlc_NtkDupOneBuffer( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFanin, Vec_Int_t * vFanins, int fIsFi )
{
    int iObj = Wlc_ObjAlloc( pNew, WLC_OBJ_BUF, pObj->Signed, pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj( pNew, iObj );
    Vec_IntFill( vFanins, 1, iFanin );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCo( pNew, pObjNew, fIsFi );
}